

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

btCollisionShape * __thiscall
btCollisionWorldImporter::createCapsuleShapeY
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  int iVar1;
  int iVar2;
  btCollisionShape **ptr;
  btCollisionShape *this_00;
  btCollisionShape **ppbVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  this_00 = (btCollisionShape *)btAlignedAllocInternal(0x48,0x10);
  btCapsuleShape::btCapsuleShape((btCapsuleShape *)this_00,radius,height);
  iVar1 = (this->m_allocatedCollisionShapes).m_size;
  iVar2 = (this->m_allocatedCollisionShapes).m_capacity;
  if (iVar1 == iVar2) {
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar2 < iVar6) {
      if (iVar6 == 0) {
        ppbVar3 = (btCollisionShape **)0x0;
      }
      else {
        ppbVar3 = (btCollisionShape **)btAlignedAllocInternal((long)iVar6 << 3,0x10);
      }
      lVar4 = (long)(this->m_allocatedCollisionShapes).m_size;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          ppbVar3[lVar5] = (this->m_allocatedCollisionShapes).m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      ptr = (this->m_allocatedCollisionShapes).m_data;
      if (ptr != (btCollisionShape **)0x0) {
        if ((this->m_allocatedCollisionShapes).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_allocatedCollisionShapes).m_data = (btCollisionShape **)0x0;
      }
      (this->m_allocatedCollisionShapes).m_ownsMemory = true;
      (this->m_allocatedCollisionShapes).m_data = ppbVar3;
      (this->m_allocatedCollisionShapes).m_capacity = iVar6;
    }
  }
  iVar1 = (this->m_allocatedCollisionShapes).m_size;
  (this->m_allocatedCollisionShapes).m_data[iVar1] = this_00;
  (this->m_allocatedCollisionShapes).m_size = iVar1 + 1;
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createCapsuleShapeY(btScalar radius, btScalar height)
{
	btCapsuleShape* shape = new btCapsuleShape(radius,height);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}